

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O3

bool __thiscall
acto::intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::push
          (queue<acto::core::object_t,_acto::intrusive::spin_lock> *this,object_t *node)

{
  spin_lock *this_00;
  undefined1 auVar1 [16];
  char cVar2;
  object_t *poVar3;
  
  this_00 = &this->mutex_;
  LOCK();
  cVar2 = (this->mutex_).flag_.super___atomic_flag_base._M_i;
  (this->mutex_).flag_.super___atomic_flag_base._M_i = true;
  UNLOCK();
  while (cVar2 != '\0') {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this_00;
    std::
    __atomic_wait_address_v<bool,std::atomic_flag::wait(bool,std::memory_order)const::_lambda()_1_>
              ((bool *)this_00,true,(anon_class_16_2_20c11228_for___vfn)(auVar1 << 0x40));
    LOCK();
    cVar2 = (this_00->flag_).super___atomic_flag_base._M_i;
    (this_00->flag_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  }
  poVar3 = this->tail_;
  if (poVar3 == (object_t *)0x0) {
    (node->super_node<acto::core::object_t>).next = node;
    poVar3 = node;
  }
  else {
    (node->super_node<acto::core::object_t>).next = (poVar3->super_node<acto::core::object_t>).next;
    (poVar3->super_node<acto::core::object_t>).next = node;
    poVar3 = (node->super_node<acto::core::object_t>).next;
  }
  this->tail_ = node;
  spin_lock::unlock(this_00);
  return poVar3 == node;
}

Assistant:

bool push(T* const node) {
    std::lock_guard g(mutex_);

    if (tail_) {
      node->next = tail_->next;
      tail_->next = node;
    } else {
      node->next = node;
    }
    tail_ = node;
    return node->next == node;
  }